

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *nonz,int rn)

{
  bool bVar1;
  int iVar2;
  fpclass_type fVar3;
  int32_t iVar4;
  fpclass_type fVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  cpp_dec_float<200U,_int,_void> *pcVar27;
  int iVar28;
  byte bVar29;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_39c;
  undefined1 local_398 [32];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [13];
  undefined3 uStack_32b;
  int iStack_328;
  bool bStack_324;
  undefined8 local_320;
  int *local_318;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_308;
  int *local_300;
  int *local_2f8;
  pointer local_2f0;
  int *local_2e8;
  ulong local_2e0;
  int *local_2d8;
  long local_2d0;
  int *local_2c8;
  cpp_dec_float<200U,_int,_void> *local_2c0;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  fpclass_type local_1c0;
  int32_t iStack_1bc;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar29 = 0;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  iVar10 = 0;
  uStack_1cb = 0;
  local_240._0_4_ = cpp_dec_float_finite;
  local_240._4_4_ = 0x1c;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  bStack_244 = false;
  local_2f0 = (this->l).rval.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2f8 = (this->l).ridx;
  local_2e8 = (this->l).rbeg;
  piVar15 = (this->l).rorig;
  local_2d8 = (this->l).rperm;
  if (0 < rn) {
    uVar11 = 0;
    do {
      iVar9 = local_2d8[nonz[uVar11]];
      if (uVar11 == 0) {
        uVar17 = 0;
      }
      else {
        uVar24 = uVar11 & 0xffffffff;
        do {
          uVar26 = (uint)uVar24 - 1;
          uVar16 = uVar26 >> 1;
          uVar17 = (uint)uVar24;
          if (iVar9 <= nonz[uVar16]) break;
          nonz[uVar24] = nonz[uVar16];
          uVar24 = (ulong)uVar16;
          uVar17 = uVar16;
        } while (1 < uVar26);
      }
      uVar11 = uVar11 + 1;
      nonz[(int)uVar17] = iVar9;
    } while (uVar11 != (uint)rn);
  }
  local_318 = nonz + this->thedim;
  if (0 < rn) {
    uVar11 = 0;
    local_310 = eps;
    local_308 = vec;
    local_300 = piVar15;
    local_2c8 = nonz;
    do {
      iVar9 = *nonz;
      local_39c = rn - 1;
      iVar28 = nonz[(long)rn + -1];
      iVar10 = 1;
      iVar13 = 0;
      if (3 < rn) {
        iVar13 = 0;
        do {
          iVar2 = nonz[iVar10];
          iVar23 = nonz[(long)iVar10 + 1];
          piVar14 = nonz + iVar13;
          if (iVar23 < iVar2) {
            iVar13 = iVar10;
            iVar23 = iVar2;
            if (iVar2 <= iVar28) goto LAB_00549cf6;
          }
          else {
            if (iVar23 <= iVar28) goto LAB_00549cf6;
            iVar13 = iVar10 + 1;
          }
          *piVar14 = iVar23;
          iVar10 = iVar13 * 2 + 1;
        } while (iVar10 < (int)(rn - 2U));
      }
      if ((iVar10 < (int)local_39c) && (iVar28 < nonz[iVar10])) {
        nonz[iVar13] = nonz[iVar10];
        iVar13 = iVar10;
      }
      piVar14 = nonz + iVar13;
LAB_00549cf6:
      *piVar14 = iVar28;
      iVar10 = piVar15[iVar9];
      pcVar27 = &local_308[iVar10].m_backend;
      pcVar19 = pcVar27;
      puVar21 = (uint *)local_238;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar21 = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
      }
      iVar9 = local_308[iVar10].m_backend.exp;
      bVar1 = local_308[iVar10].m_backend.neg;
      fVar3 = local_308[iVar10].m_backend.fpclass;
      iVar4 = local_308[iVar10].m_backend.prec_elem;
      iStack_1bc = iVar4;
      local_1c0 = fVar3;
      pcVar19 = pcVar27;
      puVar21 = (uint *)local_398;
      iStack_1c8 = iVar9;
      bStack_1c4 = bVar1;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        *puVar21 = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4);
        puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
      }
      pnVar18 = local_310;
      pcVar19 = &local_b0;
      for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar19->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar29 * -2 + 1) * 4);
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + ((ulong)bVar29 * -2 + 1) * 4);
      }
      local_b0.exp = (local_310->m_backend).exp;
      local_b0.neg = (local_310->m_backend).neg;
      local_b0.fpclass = (local_310->m_backend).fpclass;
      local_b0.prec_elem = (local_310->m_backend).prec_elem;
      local_320._4_4_ = iVar4;
      local_320._0_4_ = fVar3;
      bStack_324 = bVar1;
      if ((bVar1 == true) && (local_398._0_4_ != 0 || fVar3 != cpp_dec_float_finite)) {
        bStack_324 = false;
      }
      iStack_328 = iVar9;
      if ((local_b0.fpclass == cpp_dec_float_NaN || fVar3 == cpp_dec_float_NaN) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_398,&local_b0), iVar9 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar27,0);
      }
      else {
        local_318[-1] = iVar10;
        local_318 = local_318 + -1;
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar9 = local_2e8[iVar10];
        iVar28 = local_2e8[(long)iVar10 + 1] - iVar9;
        if (iVar28 != 0 && iVar9 <= local_2e8[(long)iVar10 + 1]) {
          local_2e0 = uVar11;
          piVar14 = local_2f8 + iVar9;
          pcVar27 = &local_2f0[iVar9].m_backend;
          do {
            lVar25 = (long)*piVar14;
            pnVar18 = local_308 + lVar25;
            pnVar20 = pnVar18;
            puVar21 = (uint *)local_2b8;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              *puVar21 = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
              puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
            }
            iStack_248 = local_308[lVar25].m_backend.exp;
            bStack_244 = local_308[lVar25].m_backend.neg;
            fVar5 = local_308[lVar25].m_backend.fpclass;
            iVar7 = local_308[lVar25].m_backend.prec_elem;
            local_240._0_4_ = fVar5;
            local_240._4_4_ = iVar7;
            if (fVar5 == cpp_dec_float_NaN) {
LAB_00549f31:
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_238;
              if ((cpp_dec_float<200U,_int,_void> *)local_398 != pcVar27) {
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar29 * -8 + 4);
                }
                iStack_328 = iStack_1c8;
                bStack_324 = bStack_1c4;
                local_320._0_4_ = local_1c0;
                local_320._4_4_ = iStack_1bc;
                pcVar19 = pcVar27;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar19);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                        ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                         (cpp_dec_float<200U,_int,_void> *)local_398);
              if ((fpclass_type)local_240 == cpp_dec_float_NaN) {
LAB_0054a00f:
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar22->data)._M_elems[0] = (pcVar19->data)._M_elems[0];
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar29 * -8 + 4);
                }
                iStack_328 = iStack_248;
                bStack_324 = bStack_244;
                local_320._0_4_ = (fpclass_type)local_240;
                local_320._4_4_ = local_240._4_4_;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_398,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                    (cpp_dec_float<200U,_int,_void> *)local_398);
                if (iVar10 != 0) goto LAB_0054a00f;
                local_320._0_4_ = cpp_dec_float_finite;
                local_320._4_4_ = 0x1c;
                local_398._0_16_ = (undefined1  [16])0x0;
                local_398._16_16_ = (undefined1  [16])0x0;
                local_378 = (undefined1  [16])0x0;
                local_368 = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = SUB1613((undefined1  [16])0x0,0);
                uStack_32b = 0;
                iStack_328 = 0;
                bStack_324 = false;
                boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                          ((cpp_dec_float<200u,int,void> *)local_398,1e-100);
              }
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_398;
              pnVar20 = pnVar18;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              (pnVar18->m_backend).exp = iStack_328;
              (pnVar18->m_backend).neg = bStack_324;
              (pnVar18->m_backend).fpclass = (fpclass_type)local_320;
              (pnVar18->m_backend).prec_elem = local_320._4_4_;
              nonz = local_2c8;
            }
            else {
              local_2c0 = pcVar27;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_398,0,(type *)0x0);
              pcVar27 = local_2c0;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)local_2b8,
                                 (cpp_dec_float<200U,_int,_void> *)local_398);
              iVar10 = iStack_1c8;
              if (iVar9 != 0) goto LAB_00549f31;
              puVar21 = (uint *)local_238;
              pcVar19 = &local_1b0;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar19->data)._M_elems[0] = *puVar21;
                puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              local_1b0.exp = iStack_1c8;
              local_1b0.neg = bStack_1c4;
              fVar3 = local_1c0;
              local_1b0.fpclass = local_1c0;
              iVar4 = iStack_1bc;
              local_1b0.prec_elem = iStack_1bc;
              if (local_1b0.data._M_elems[0] != 0 || local_1c0 != cpp_dec_float_finite) {
                local_1b0.neg = (bool)(bStack_1c4 ^ 1);
              }
              local_2d0 = lVar25;
              local_320._0_4_ = cpp_dec_float_finite;
              local_320._4_4_ = 0x1c;
              local_398._0_16_ = (undefined1  [16])0x0;
              local_398._16_16_ = (undefined1  [16])0x0;
              local_378 = (undefined1  [16])0x0;
              local_368 = (undefined1  [16])0x0;
              local_358 = (undefined1  [16])0x0;
              local_348 = (undefined1  [16])0x0;
              local_338 = SUB1613((undefined1  [16])0x0,0);
              uStack_32b = 0;
              iStack_328 = 0;
              bStack_324 = false;
              pcVar19 = &local_1b0;
              if ((cpp_dec_float<200U,_int,_void> *)local_398 != pcVar27) {
                puVar21 = (uint *)local_238;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_398;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar19->data)._M_elems[0] = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                  pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar19 + (ulong)bVar29 * -8 + 4);
                }
                iStack_328 = iVar10;
                bStack_324 = local_1b0.neg;
                local_320._0_4_ = fVar3;
                local_320._4_4_ = iVar4;
                pcVar19 = pcVar27;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_398,pcVar19);
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_398;
              puVar21 = (uint *)local_2b8;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                *puVar21 = (pcVar19->data)._M_elems[0];
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
                puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
              }
              iStack_248 = iStack_328;
              bStack_244 = bStack_324;
              local_240._0_4_ = (fpclass_type)local_320;
              local_240._4_4_ = local_320._4_4_;
              puVar21 = (uint *)local_2b8;
              pcVar19 = (cpp_dec_float<200U,_int,_void> *)local_398;
              for (lVar12 = 0x1c; lVar25 = local_2d0, lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar19->data)._M_elems[0] = *puVar21;
                puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar29 * -8 + 4)
                ;
              }
              pnVar20 = local_310;
              pcVar19 = &local_130;
              for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pcVar19->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
                pcVar19 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar19 + ((ulong)bVar29 * -2 + 1) * 4);
              }
              local_130.exp = (local_310->m_backend).exp;
              local_130.neg = (local_310->m_backend).neg;
              fVar6 = (local_310->m_backend).fpclass;
              iVar8 = (local_310->m_backend).prec_elem;
              local_130.fpclass = fVar6;
              local_130.prec_elem = iVar8;
              if ((bStack_324 == true) &&
                 (local_398._0_4_ != 0 || (fpclass_type)local_320 != cpp_dec_float_finite)) {
                bStack_324 = false;
              }
              if ((fVar6 != cpp_dec_float_NaN && (fpclass_type)local_320 != cpp_dec_float_NaN) &&
                 (iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_398,&local_130),
                 0 < iVar10)) {
                puVar21 = (uint *)local_2b8;
                pnVar20 = pnVar18;
                for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pnVar20->m_backend).data._M_elems[0] = *puVar21;
                  puVar21 = puVar21 + (ulong)bVar29 * -2 + 1;
                  pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar20 + ((ulong)bVar29 * -2 + 1) * 4);
                }
                (pnVar18->m_backend).exp = iStack_248;
                (pnVar18->m_backend).neg = bStack_244;
                (pnVar18->m_backend).fpclass = (fpclass_type)local_240;
                (pnVar18->m_backend).prec_elem = local_240._4_4_;
                iVar10 = local_2d8[lVar25];
                uVar17 = local_39c;
                if (0 < (int)local_39c) {
                  do {
                    uVar16 = uVar17 - 1;
                    uVar26 = uVar16 >> 1;
                    if (iVar10 <= nonz[uVar26]) break;
                    nonz[uVar17] = nonz[uVar26];
                    uVar17 = uVar26;
                  } while (1 < uVar16);
                }
                local_39c = local_39c + 1;
                nonz[(int)uVar17] = iVar10;
              }
            }
            piVar14 = piVar14 + 1;
            pcVar27 = pcVar27 + 1;
            bVar1 = 1 < iVar28;
            piVar15 = local_300;
            uVar11 = local_2e0;
            iVar28 = iVar28 + -1;
          } while (bVar1);
        }
      }
      iVar10 = (int)uVar11;
      rn = local_39c;
    } while (0 < (int)local_39c);
  }
  if (0 < iVar10) {
    lVar12 = 0;
    do {
      nonz[lVar12] = local_318[lVar12];
      lVar12 = lVar12 + 1;
    } while (iVar10 != (int)lVar12);
  }
  return iVar10;
}

Assistant:

int CLUFactor<R>::solveLleft(R eps, R* vec, int* nonz, int rn)
{
   int i, j, k, n;
   int r;
   R x, y;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig, *rperm;
   int* last;

   ridx  = l.ridx;
   rval  = l.rval.data();
   rbeg  = l.rbeg;
   rorig = l.rorig;
   rperm = l.rperm;
   n     = 0;

   i = l.firstUpdate - 1;
#ifndef SOPLEX_WITH_L_ROWS
#pragma warn "Not yet implemented, define SOPLEX_WITH_L_ROWS"
   R*   lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   for(; i >= 0; --i)
   {
      k   = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x   = 0;

      for(j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   /*  move rhsidx to a heap
    */
   for(i = 0; i < rn;)
      enQueueMax(nonz, &i, rperm[nonz[i]]);

   last = nonz + thedim;

   while(rn > 0)
   {
      i = deQueueMax(nonz, &rn);
      r = rorig[i];
      x = vec[r];

      if(isNotZero(x, eps))
      {
         *(--last) = r;
         n++;
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            int m = *idx++;
            y = vec[m];

            if(y == 0)
            {
               y = -x * *val++;

               if(isNotZero(y, eps))
               {
                  vec[m] = y;
                  enQueueMax(nonz, &rn, rperm[m]);
               }
            }
            else
            {
               y -= x * *val++;
               vec[m] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
      else
         vec[r] = 0;
   }

   for(i = 0; i < n; ++i)
      *nonz++ = *last++;

#endif

   return n;
}